

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io.cpp
# Opt level: O0

CTxDestination *
anon_unknown.dwarf_17c577::DecodeDestination
          (string *str,CChainParams *params,string *error_str,
          vector<int,_std::allocator<int>_> *error_locations)

{
  byte bVar1;
  string_view str_00;
  __type_conflict2 _Var2;
  bool bVar3;
  uint uVar4;
  size_type sVar5;
  byte *pbVar6;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var7;
  const_iterator cVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  unsigned_long *args;
  unsigned_long *fmt;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  size_type sVar9;
  CTxDestination *in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  int version;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *script_prefix;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pubkey_prefix;
  bool is_bech32;
  string_view byte_str;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  res;
  WitnessV1Taproot tap;
  WitnessV0ScriptHash scriptid;
  WitnessV0KeyHash keyid;
  DecodeResult dec;
  uint160 hash;
  CChainParams *in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9f0;
  Base58Type in_stack_fffffffffffff9f4;
  undefined4 in_stack_fffffffffffff9f8;
  int in_stack_fffffffffffff9fc;
  char *in_stack_fffffffffffffa00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffa08;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffa10;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffa18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffa28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa48;
  CharLimit in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab4;
  CharLimit in_stack_fffffffffffffbd8;
  string *in_stack_fffffffffffffbe0;
  uchar local_350 [24];
  undefined1 local_338 [88];
  undefined1 local_2e0 [64];
  undefined1 local_2a0 [64];
  undefined1 local_260 [64];
  undefined1 local_220 [120];
  undefined1 local_1a8 [32];
  undefined1 local_188 [32];
  undefined1 local_168 [64];
  undefined1 local_128 [32];
  int local_108;
  undefined1 local_c8 [32];
  undefined1 local_a8 [160];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff9e8);
  uint160::uint160((uint160 *)in_stack_fffffffffffff9e8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
             (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
  CChainParams::Bech32HRP_abi_cxx11_(in_stack_fffffffffffff9e8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9e8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa10._M_current,(size_type)in_stack_fffffffffffffa08._M_current,
             (size_type)in_stack_fffffffffffffa00);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa08._M_current);
  str_00._M_str = (char *)in_stack_fffffffffffffa48;
  str_00._M_len = (size_t)in_stack_fffffffffffffa40;
  ToLower_abi_cxx11_(str_00);
  CChainParams::Bech32HRP_abi_cxx11_(in_stack_fffffffffffff9e8);
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffa18._M_current,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffa10._M_current);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9e8);
  if ((_Var2) ||
     (bVar3 = DecodeBase58Check((string *)in_stack_fffffffffffffa10._M_current,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                in_stack_fffffffffffffa08._M_current,
                                (int)((ulong)in_stack_fffffffffffffa00 >> 0x20)), !bVar3)) {
    if (_Var2) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff9e8)
      ;
      bech32::Decode((string *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                     in_stack_fffffffffffffaa8);
      if ((local_108 == 1) || (local_108 == 2)) {
        bVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        if (bVar3) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                     (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
          memset(local_128,0,0x20);
          CNoDestination::CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
          std::
          variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
          ::variant<CNoDestination,void,void,CNoDestination,void>
                    ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                     (CNoDestination *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0)
                    );
          CNoDestination::~CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
        }
        else {
          CChainParams::Bech32HRP_abi_cxx11_(in_stack_fffffffffffff9e8);
          _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffa18._M_current,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffa10._M_current);
          if (((_Var2 ^ 0xffU) & 1) == 0) {
            pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                                CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
            bVar1 = *pbVar6;
            if ((bVar1 == 0) && (local_108 != 1)) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                        (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
              memset(local_188,0,0x20);
              CNoDestination::CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
              std::
              variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
              ::variant<CNoDestination,void,void,CNoDestination,void>
                        ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                          *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                         (CNoDestination *)
                         CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
              CNoDestination::~CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
            }
            else if ((bVar1 == 0) || (local_108 == 2)) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffff9e8);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                        (in_stack_fffffffffffffa28,(size_type)in_stack_fffffffffffffa20);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
              _Var7 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                                  CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
              cVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
              bVar3 = ConvertBits<5,8,false,(anonymous_namespace)::DecodeDestination(std::__cxx11::string_const&,CChainParams_const&,std::__cxx11::string&,std::vector<int,std::allocator<int>>*)::__0,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,(anonymous_namespace)::IntIdentity>
                                (local_350,_Var7._M_current,cVar8._M_current);
              if (bVar3) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffff9e8);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffa08._M_current,in_stack_fffffffffffffa00);
                if (bVar1 == 0) {
                  WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)in_stack_fffffffffffff9e8);
                  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     in_stack_fffffffffffff9e8);
                  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         BaseHash<uint160>::size((BaseHash<uint160> *)in_stack_fffffffffffff9e8);
                  if (__str == this) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
                    BaseHash<uint160>::begin((BaseHash<uint160> *)in_stack_fffffffffffff9e8);
                    std::
                    copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
                              (in_stack_fffffffffffffa18,in_stack_fffffffffffffa10,
                               (uchar *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8
                                                ));
                    std::
                    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                    ::variant<WitnessV0KeyHash,void,void,WitnessV0KeyHash,void>
                              ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                               (WitnessV0KeyHash *)
                               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
                  }
                  else {
                    WitnessV0ScriptHash::WitnessV0ScriptHash
                              ((WitnessV0ScriptHash *)in_stack_fffffffffffff9e8);
                    args = (unsigned_long *)
                           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      in_stack_fffffffffffff9e8);
                    fmt = (unsigned_long *)
                          BaseHash<uint256>::size((BaseHash<uint256> *)in_stack_fffffffffffff9e8);
                    if (args == fmt) {
                      __last._M_current = local_350;
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
                      __first._M_current =
                           BaseHash<uint256>::begin((BaseHash<uint256> *)in_stack_fffffffffffff9e8);
                      std::
                      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
                                (__first,__last,
                                 (uchar *)CONCAT44(in_stack_fffffffffffff9fc,
                                                   in_stack_fffffffffffff9f8));
                      std::
                      variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                      ::variant<WitnessV0ScriptHash,void,void,WitnessV0ScriptHash,void>
                                ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                  *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                                 (WitnessV0ScriptHash *)
                                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
                    }
                    else {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_fffffffffffff9e8);
                      tinyformat::
                      format<unsigned_long,std::basic_string_view<char,std::char_traits<char>>>
                                ((char *)fmt,args,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_fffffffffffffa18._M_current);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                                (this,__str);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff9e8);
                      memset(local_220,0,0x20);
                      CNoDestination::CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
                      std::
                      variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                      ::variant<CNoDestination,void,void,CNoDestination,void>
                                ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                  *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                                 (CNoDestination *)
                                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
                      CNoDestination::~CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
                    }
                  }
                }
                else if ((bVar1 == 1) &&
                        (sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *
                                            )in_stack_fffffffffffff9e8), sVar9 == 0x20)) {
                  WitnessV1Taproot::WitnessV1Taproot((WitnessV1Taproot *)in_stack_fffffffffffff9e8);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
                  XOnlyPubKey::begin((XOnlyPubKey *)in_stack_fffffffffffff9e8);
                  std::
                  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
                            (in_stack_fffffffffffffa18,in_stack_fffffffffffffa10,
                             (uchar *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8))
                  ;
                  std::
                  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                  ::variant<WitnessV1Taproot,void,void,WitnessV1Taproot,void>
                            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                              *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                             (WitnessV1Taproot *)
                             CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
                }
                else {
                  bVar3 = CScript::IsPayToAnchor
                                    (in_stack_fffffffffffff9fc,
                                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
                  in_stack_fffffffffffff9fc = CONCAT13(bVar3,(int3)in_stack_fffffffffffff9fc);
                  if (bVar3) {
                    PayToAnchor::PayToAnchor((PayToAnchor *)in_stack_fffffffffffffa40);
                    std::
                    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                    ::variant<PayToAnchor,void,void,PayToAnchor,void>
                              ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                               (PayToAnchor *)
                               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
                    PayToAnchor::~PayToAnchor((PayToAnchor *)in_stack_fffffffffffff9e8);
                  }
                  else if (bVar1 < 0x11) {
                    sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       in_stack_fffffffffffff9e8);
                    if ((sVar9 < 2) ||
                       (sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           in_stack_fffffffffffff9e8), 0x28 < sVar9)) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_fffffffffffff9e8);
                      tinyformat::
                      format<unsigned_long,std::basic_string_view<char,std::char_traits<char>>>
                                ((char *)in_stack_fffffffffffffa28,
                                 (unsigned_long *)in_stack_fffffffffffffa20,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_fffffffffffffa18._M_current);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                                (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff9e8);
                      memset(local_2a0,0,0x20);
                      CNoDestination::CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
                      std::
                      variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                      ::variant<CNoDestination,void,void,CNoDestination,void>
                                ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                  *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                                 (CNoDestination *)
                                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
                      CNoDestination::~CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
                    }
                    else {
                      WitnessUnknown::WitnessUnknown
                                ((WitnessUnknown *)
                                 CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                                 in_stack_fffffffffffff9f4,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_fffffffffffff9e8);
                      std::
                      variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                      ::variant<WitnessUnknown,void,void,WitnessUnknown,void>
                                ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                  *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                                 (WitnessUnknown *)
                                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
                      WitnessUnknown::~WitnessUnknown((WitnessUnknown *)in_stack_fffffffffffff9e8);
                    }
                  }
                  else {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                                (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0
                                                ));
                    memset(local_260,0,0x20);
                    CNoDestination::CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
                    std::
                    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                    ::variant<CNoDestination,void,void,CNoDestination,void>
                              ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                               (CNoDestination *)
                               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
                    CNoDestination::~CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
                  }
                }
              }
              else {
                tinyformat::format<>((char *)in_stack_fffffffffffffa18._M_current);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff9e8);
                memset(local_2e0,0,0x20);
                CNoDestination::CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
                std::
                variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                ::variant<CNoDestination,void,void,CNoDestination,void>
                          ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                            *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                           (CNoDestination *)
                           CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
                CNoDestination::~CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
              }
            }
            else {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                        (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
              memset(local_1a8,0,0x20);
              CNoDestination::CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
              std::
              variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
              ::variant<CNoDestination,void,void,CNoDestination,void>
                        ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                          *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                         (CNoDestination *)
                         CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
              CNoDestination::~CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
            }
          }
          else {
            CChainParams::Bech32HRP_abi_cxx11_(in_stack_fffffffffffff9e8);
            tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                      ((char *)in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffa18._M_current);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff9e8);
            memset(local_168,0,0x20);
            CNoDestination::CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
            std::
            variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
            ::variant<CNoDestination,void,void,CNoDestination,void>
                      ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                       (CNoDestination *)
                       CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
            CNoDestination::~CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
          }
        }
      }
      else {
        bech32::LocateErrors(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
        if (in_R8 != 0) {
          std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                     (vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
        }
        memset(local_338,0,0x20);
        CNoDestination::CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
        std::
        variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
        ::variant<CNoDestination,void,void,CNoDestination,void>
                  ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                   (CNoDestination *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
        CNoDestination::~CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                 *)in_stack_fffffffffffff9e8);
      }
      bech32::DecodeResult::~DecodeResult((DecodeResult *)in_stack_fffffffffffff9e8);
    }
    else {
      bVar3 = DecodeBase58((string *)in_stack_fffffffffffffa10._M_current,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffa08._M_current,
                           (int)((ulong)in_stack_fffffffffffffa00 >> 0x20));
      if (bVar3) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                   (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                   (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
      }
      memset(local_c8,0,0x20);
      CNoDestination::CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
      std::
      variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
      ::variant<CNoDestination,void,void,CNoDestination,void>
                ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                 (CNoDestination *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
      CNoDestination::~CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
    }
    goto LAB_001f58a9;
  }
  CChainParams::Base58Prefix
            ((CChainParams *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
             in_stack_fffffffffffff9f4);
  sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff9e8);
  uVar4 = base_blob<160U>::size();
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff9e8);
  if (sVar9 == uVar4 + sVar5) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
    bVar3 = std::
            equal<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )in_stack_fffffffffffffa18._M_current,
                       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )in_stack_fffffffffffffa10._M_current,in_stack_fffffffffffffa08);
    if (bVar3) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff9e8)
      ;
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                  CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
      base_blob<160U>::begin((base_blob<160U> *)in_stack_fffffffffffff9e8);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
                (in_stack_fffffffffffffa18,in_stack_fffffffffffffa10,
                 (uchar *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      PKHash::PKHash((PKHash *)in_stack_fffffffffffff9e8,(uint160 *)0x1f49b1);
      std::
      variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
      ::variant<PKHash,void,void,PKHash,void>
                ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                 (PKHash *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
      goto LAB_001f58a9;
    }
  }
  CChainParams::Base58Prefix
            ((CChainParams *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
             in_stack_fffffffffffff9f4);
  sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff9e8);
  uVar4 = base_blob<160U>::size();
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff9e8);
  if (sVar9 == uVar4 + sVar5) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
    bVar3 = std::
            equal<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )in_stack_fffffffffffffa18._M_current,
                       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )in_stack_fffffffffffffa10._M_current,in_stack_fffffffffffffa08);
    if (bVar3) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff9e8)
      ;
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                  CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
      base_blob<160U>::begin((base_blob<160U> *)in_stack_fffffffffffff9e8);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
                (in_stack_fffffffffffffa18,in_stack_fffffffffffffa10,
                 (uchar *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      ScriptHash::ScriptHash((ScriptHash *)in_stack_fffffffffffff9e8,(uint160 *)0x1f4bb0);
      std::
      variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
      ::variant<ScriptHash,void,void,ScriptHash,void>
                ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                 (ScriptHash *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
      goto LAB_001f58a9;
    }
  }
  sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff9e8);
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff9e8);
  if (sVar9 < sVar5) {
LAB_001f4c7f:
    sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff9e8);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff9e8);
    if (sVar5 <= sVar9) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
      bVar3 = std::
              equal<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )in_stack_fffffffffffffa18._M_current,
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )in_stack_fffffffffffffa10._M_current,in_stack_fffffffffffffa08);
      if (bVar3) goto LAB_001f4d27;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
    bVar3 = std::
            equal<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )in_stack_fffffffffffffa18._M_current,
                       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )in_stack_fffffffffffffa10._M_current,in_stack_fffffffffffffa08);
    if (!bVar3) goto LAB_001f4c7f;
LAB_001f4d27:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
  }
  memset(local_a8,0,0x20);
  CNoDestination::CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<CNoDestination,void,void,CNoDestination,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
             (CNoDestination *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
  CNoDestination::~CNoDestination((CNoDestination *)in_stack_fffffffffffff9e8);
LAB_001f58a9:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CTxDestination DecodeDestination(const std::string& str, const CChainParams& params, std::string& error_str, std::vector<int>* error_locations)
{
    std::vector<unsigned char> data;
    uint160 hash;
    error_str = "";

    // Note this will be false if it is a valid Bech32 address for a different network
    bool is_bech32 = (ToLower(str.substr(0, params.Bech32HRP().size())) == params.Bech32HRP());

    if (!is_bech32 && DecodeBase58Check(str, data, 21)) {
        // base58-encoded Bitcoin addresses.
        // Public-key-hash-addresses have version 0 (or 111 testnet).
        // The data vector contains RIPEMD160(SHA256(pubkey)), where pubkey is the serialized public key.
        const std::vector<unsigned char>& pubkey_prefix = params.Base58Prefix(CChainParams::PUBKEY_ADDRESS);
        if (data.size() == hash.size() + pubkey_prefix.size() && std::equal(pubkey_prefix.begin(), pubkey_prefix.end(), data.begin())) {
            std::copy(data.begin() + pubkey_prefix.size(), data.end(), hash.begin());
            return PKHash(hash);
        }
        // Script-hash-addresses have version 5 (or 196 testnet).
        // The data vector contains RIPEMD160(SHA256(cscript)), where cscript is the serialized redemption script.
        const std::vector<unsigned char>& script_prefix = params.Base58Prefix(CChainParams::SCRIPT_ADDRESS);
        if (data.size() == hash.size() + script_prefix.size() && std::equal(script_prefix.begin(), script_prefix.end(), data.begin())) {
            std::copy(data.begin() + script_prefix.size(), data.end(), hash.begin());
            return ScriptHash(hash);
        }

        // If the prefix of data matches either the script or pubkey prefix, the length must have been wrong
        if ((data.size() >= script_prefix.size() &&
                std::equal(script_prefix.begin(), script_prefix.end(), data.begin())) ||
            (data.size() >= pubkey_prefix.size() &&
                std::equal(pubkey_prefix.begin(), pubkey_prefix.end(), data.begin()))) {
            error_str = "Invalid length for Base58 address (P2PKH or P2SH)";
        } else {
            error_str = "Invalid or unsupported Base58-encoded address.";
        }
        return CNoDestination();
    } else if (!is_bech32) {
        // Try Base58 decoding without the checksum, using a much larger max length
        if (!DecodeBase58(str, data, 100)) {
            error_str = "Invalid or unsupported Segwit (Bech32) or Base58 encoding.";
        } else {
            error_str = "Invalid checksum or length of Base58 address (P2PKH or P2SH)";
        }
        return CNoDestination();
    }

    data.clear();
    const auto dec = bech32::Decode(str);
    if (dec.encoding == bech32::Encoding::BECH32 || dec.encoding == bech32::Encoding::BECH32M) {
        if (dec.data.empty()) {
            error_str = "Empty Bech32 data section";
            return CNoDestination();
        }
        // Bech32 decoding
        if (dec.hrp != params.Bech32HRP()) {
            error_str = strprintf("Invalid or unsupported prefix for Segwit (Bech32) address (expected %s, got %s).", params.Bech32HRP(), dec.hrp);
            return CNoDestination();
        }
        int version = dec.data[0]; // The first 5 bit symbol is the witness version (0-16)
        if (version == 0 && dec.encoding != bech32::Encoding::BECH32) {
            error_str = "Version 0 witness address must use Bech32 checksum";
            return CNoDestination();
        }
        if (version != 0 && dec.encoding != bech32::Encoding::BECH32M) {
            error_str = "Version 1+ witness address must use Bech32m checksum";
            return CNoDestination();
        }
        // The rest of the symbols are converted witness program bytes.
        data.reserve(((dec.data.size() - 1) * 5) / 8);
        if (ConvertBits<5, 8, false>([&](unsigned char c) { data.push_back(c); }, dec.data.begin() + 1, dec.data.end())) {

            std::string_view byte_str{data.size() == 1 ? "byte" : "bytes"};

            if (version == 0) {
                {
                    WitnessV0KeyHash keyid;
                    if (data.size() == keyid.size()) {
                        std::copy(data.begin(), data.end(), keyid.begin());
                        return keyid;
                    }
                }
                {
                    WitnessV0ScriptHash scriptid;
                    if (data.size() == scriptid.size()) {
                        std::copy(data.begin(), data.end(), scriptid.begin());
                        return scriptid;
                    }
                }

                error_str = strprintf("Invalid Bech32 v0 address program size (%d %s), per BIP141", data.size(), byte_str);
                return CNoDestination();
            }

            if (version == 1 && data.size() == WITNESS_V1_TAPROOT_SIZE) {
                static_assert(WITNESS_V1_TAPROOT_SIZE == WitnessV1Taproot::size());
                WitnessV1Taproot tap;
                std::copy(data.begin(), data.end(), tap.begin());
                return tap;
            }

            if (CScript::IsPayToAnchor(version, data)) {
                return PayToAnchor();
            }

            if (version > 16) {
                error_str = "Invalid Bech32 address witness version";
                return CNoDestination();
            }

            if (data.size() < 2 || data.size() > BECH32_WITNESS_PROG_MAX_LEN) {
                error_str = strprintf("Invalid Bech32 address program size (%d %s)", data.size(), byte_str);
                return CNoDestination();
            }

            return WitnessUnknown{version, data};
        } else {
            error_str = strprintf("Invalid padding in Bech32 data section");
            return CNoDestination();
        }
    }

    // Perform Bech32 error location
    auto res = bech32::LocateErrors(str);
    error_str = res.first;
    if (error_locations) *error_locations = std::move(res.second);
    return CNoDestination();
}